

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhAcquirePage(lhash_kv_engine *pEngine,unqlite_page **ppOut)

{
  ulong uVar1;
  int iVar2;
  unqlite_page *in_RAX;
  unqlite_page *pPage;
  unqlite_page *local_18;
  
  local_18 = in_RAX;
  if ((pEngine->nFreeList == 0) ||
     (iVar2 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pEngine->nFreeList,&local_18), iVar2 != 0)
     ) {
    iVar2 = (*pEngine->pIo->xNew)(pEngine->pIo->pHandle,&local_18);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    SyBigEndianUnpack64(local_18->zData,&pEngine->nFreeList);
    iVar2 = (*pEngine->pIo->xWrite)(pEngine->pHeader);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = pEngine->nFreeList;
    *(ulong *)(pEngine->pHeader->zData + 8) =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    (*pEngine->pIo->xDontJournal)(local_18);
  }
  *ppOut = local_18;
  return 0;
}

Assistant:

static int lhAcquirePage(lhash_kv_engine *pEngine,unqlite_page **ppOut)
{
	unqlite_page *pPage;
	int rc;
	if( pEngine->nFreeList != 0 ){
		/* Acquire one from the free list */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pEngine->nFreeList,&pPage);
		if( rc == UNQLITE_OK ){
			/* Point to the next free page */
			SyBigEndianUnpack64(pPage->zData,&pEngine->nFreeList);
			/* Update the database header */
			rc = pEngine->pIo->xWrite(pEngine->pHeader);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/],pEngine->nFreeList);
			/* Tell the pager do not journal this page */
			pEngine->pIo->xDontJournal(pPage);
			/* Return to the caller */
			*ppOut = pPage;
			/* All done */
			return UNQLITE_OK;
		}
	}
	/* Acquire a new page */
	rc = pEngine->pIo->xNew(pEngine->pIo->pHandle,&pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Point to the target page */
	*ppOut = pPage;
	return UNQLITE_OK;
}